

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::AssertionResult::getExpandedExpression_abi_cxx11_
          (string *__return_storage_ptr__,AssertionResult *this)

{
  string expr;
  string sStack_38;
  
  AssertionResultData::reconstructExpression_abi_cxx11_(&sStack_38,&this->m_resultData);
  if (sStack_38._M_string_length == 0) {
    getExpression_abi_cxx11_(__return_storage_ptr__,this);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,&sStack_38);
  }
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::string AssertionResult::getExpandedExpression() const {
        std::string expr = m_resultData.reconstructExpression();
        return expr.empty()
                ? getExpression()
                : expr;
    }